

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall FIX::Message::Message(Message *this)

{
  message_order local_38;
  
  local_38.m_mode = normal;
  local_38._4_8_ = 0;
  local_38.m_groupOrder._4_8_ = 0;
  local_38._20_8_ = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_38);
  shared_array<int>::~shared_array(&local_38.m_groupOrder);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001fd438;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  return;
}

Assistant:

Message::Message()
    : m_validStructure(true),
      m_tag(0) {}